

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O3

int pt_qry_cond_branch(pt_query_decoder *decoder,int *taken)

{
  pt_tnt_cache *cache;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint32_t uVar4;
  uint8_t uVar5;
  undefined7 uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  
  if (taken == (int *)0x0 || decoder == (pt_query_decoder *)0x0) {
    return -2;
  }
  cache = &decoder->tnt;
  iVar9 = pt_tnt_cache_query(cache);
  if (iVar9 < 0) {
    if (iVar9 != -8) {
      return iVar9;
    }
    uVar1 = (decoder->evdec).time.tsc;
    uVar2 = (decoder->evdec).time.base;
    uVar3 = (decoder->evdec).time.fc;
    uVar7 = (decoder->evdec).time.ctc;
    uVar8 = (decoder->evdec).time.ctc_cyc;
    uVar4 = (decoder->evdec).time.lost_cyc;
    uVar5 = (decoder->evdec).time.cbr;
    uVar6 = *(undefined7 *)&(decoder->evdec).time.field_0x29;
    (decoder->last_time).lost_mtc = (decoder->evdec).time.lost_mtc;
    (decoder->last_time).lost_cyc = uVar4;
    (decoder->last_time).cbr = uVar5;
    *(undefined7 *)&(decoder->last_time).field_0x29 = uVar6;
    (decoder->last_time).fc = uVar3;
    (decoder->last_time).ctc = uVar7;
    (decoder->last_time).ctc_cyc = uVar8;
    (decoder->last_time).tsc = uVar1;
    (decoder->last_time).base = uVar2;
    iVar9 = pt_qry_cache_tnt(decoder);
    if (iVar9 < 0) {
      return iVar9;
    }
    iVar9 = pt_tnt_cache_query(cache);
    if (iVar9 < 0) {
      if (iVar9 != -8) {
        return iVar9;
      }
      if (-1 < decoder->status) {
        return -8;
      }
      return decoder->status;
    }
  }
  *taken = iVar9;
  iVar9 = pt_tnt_cache_is_empty(cache);
  if (iVar9 == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 4;
    if (decoder->status != -7) {
      uVar10 = (uint)(((decoder->event).type & ~ptev_disabled) != ptev_tip);
    }
  }
  return uVar10;
}

Assistant:

int pt_qry_cond_branch(struct pt_query_decoder *decoder, int *taken)
{
	int query;

	if (!decoder || !taken)
		return -pte_invalid;

	query = pt_tnt_cache_query(&decoder->tnt);
	if (query < 0) {
		int errcode;

		if (query != -pte_bad_query)
			return query;

		/* If we ran out of TNT bits, check if the current event
		 * provides any.
		 *
		 * Preserve the time at the TNT event.
		 */
		decoder->last_time = decoder->evdec.time;

		errcode = pt_qry_cache_tnt(decoder);
		if (errcode < 0)
			return errcode;

		query = pt_tnt_cache_query(&decoder->tnt);
		if (query < 0) {
			if (query != -pte_bad_query)
				return query;

			/* Report any deferred event decode errors.
			 *
			 * We deferred them until we consumed the last TNT bit
			 * in our cache.
			 */
			errcode = decoder->status;
			if (errcode < 0)
				return errcode;

			return query;
		}
	}

	*taken = query;

	return pt_qry_status_flags(decoder);
}